

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O2

string * __thiscall
ymt::GetSSShareLink_abi_cxx11_(string *__return_storage_ptr__,ymt *this,Parser *user)

{
  string sStack_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (server_addr__abi_cxx11_._M_string_length == 0) {
    util::GetMachineIP_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&server_addr__abi_cxx11_,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  if (profile_name__abi_cxx11_._M_string_length == 0) {
    Parser::GetAttribute_abi_cxx11_(&local_158,(Parser *)this,GROUP_NAME);
    std::operator+(&local_178,&local_158,'-');
    Parser::GetAttribute_abi_cxx11_(&sStack_198,(Parser *)this,REMOTE_PORT);
    std::operator+(&local_138,&local_178,&sStack_198);
    std::__cxx11::string::operator=((string *)&profile_name__abi_cxx11_,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&sStack_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_158);
  }
  Parser::GetAttribute_abi_cxx11_(&local_38,(Parser *)this,METHOD);
  std::operator+(&local_d8,&local_38,':');
  Parser::GetAttribute_abi_cxx11_(&local_f8,(Parser *)this,KEY);
  std::operator+(&local_b8,&local_d8,&local_f8);
  std::operator+(&local_98,&local_b8,'@');
  std::operator+(&local_78,&local_98,&server_addr__abi_cxx11_);
  std::operator+(&sStack_198,&local_78,':');
  Parser::GetAttribute_abi_cxx11_(&local_118,(Parser *)this,REMOTE_PORT);
  std::operator+(&local_58,&sStack_198,&local_118);
  util::GetEncodedBase64(&local_158,&local_58);
  std::operator+(&local_178,"ss://",&local_158);
  std::operator+(&local_138,&local_178,"#");
  std::operator+(__return_storage_ptr__,&local_138,&profile_name__abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&sStack_198);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string ymt::GetSSShareLink(Parser & user) {

	if (server_addr_.empty()) {
		server_addr_ = util::GetMachineIP();
	}

	if (profile_name_.empty()) {
		profile_name_ = user.GetAttribute(GROUP_NAME) + '-' + user.GetAttribute(REMOTE_PORT);
	}

	return "ss://" + util::GetEncodedBase64(user.GetAttribute(METHOD)
											+ ':'
											+ user.GetAttribute(KEY)
											+ '@'
											+ server_addr_
											+ ':'
											+ user.GetAttribute(REMOTE_PORT)) + "#" + profile_name_;
}